

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBidec.c
# Opt level: O1

Hop_Obj_t *
Abc_NodeIfNodeResyn(Bdc_Man_t *p,Hop_Man_t *pHop,Hop_Obj_t *pRoot,int nVars,Vec_Int_t *vTruth,
                   uint *puCare,float dProb)

{
  ulong uVar1;
  float fVar2;
  int iVar3;
  uint *puFunc;
  Bdc_Fun_t *pBVar4;
  Bdc_Fun_t *pBVar5;
  void *pvVar6;
  Bdc_Fun_t *pBVar7;
  void *pvVar8;
  Hop_Obj_t *pCopy;
  ulong uVar9;
  long lVar10;
  int i;
  
  if (0x10 < nVars) {
    __assert_fail("nVars <= 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcBidec.c"
                  ,0x36,
                  "Hop_Obj_t *Abc_NodeIfNodeResyn(Bdc_Man_t *, Hop_Man_t *, Hop_Obj_t *, int, Vec_Int_t *, unsigned int *, float)"
                 );
  }
  puFunc = Hop_ManConvertAigToTruth
                     (pHop,(Hop_Obj_t *)((ulong)pRoot & 0xfffffffffffffffe),nVars,vTruth,0);
  if (((ulong)pRoot & 1) != 0) {
    uVar9 = (ulong)(uint)(1 << ((char)nVars - 5U & 0x1f));
    if (nVars < 6) {
      uVar9 = 1;
    }
    lVar10 = uVar9 + 1;
    do {
      puFunc[lVar10 + -2] = ~puFunc[lVar10 + -2];
      lVar10 = lVar10 + -1;
    } while (1 < lVar10);
  }
  if (0.0 <= dProb) {
    fVar2 = (1.0 - dProb) * (dProb + dProb);
    if ((fVar2 < 0.0) || (0.5 < fVar2)) {
      __assert_fail("Prob >= 0.0 && Prob <= 0.5",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcBidec.c"
                    ,0x3f,
                    "Hop_Obj_t *Abc_NodeIfNodeResyn(Bdc_Man_t *, Hop_Man_t *, Hop_Obj_t *, int, Vec_Int_t *, unsigned int *, float)"
                   );
    }
    if (0.4 <= fVar2) {
      uVar9 = (ulong)(uint)(1 << ((char)nVars - 5U & 0x1f));
      if (nVars < 6) {
        uVar9 = 1;
      }
      lVar10 = uVar9 + 1;
      do {
        puCare[lVar10 + -2] = ~puCare[lVar10 + -2];
        lVar10 = lVar10 + -1;
      } while (1 < lVar10);
      lVar10 = uVar9 + 1;
      if (dProb <= 0.5) {
        do {
          puFunc[lVar10 + -2] = puFunc[lVar10 + -2] & ~puCare[lVar10 + -2];
          lVar10 = lVar10 + -1;
        } while (1 < lVar10);
      }
      else {
        do {
          puFunc[lVar10 + -2] = puFunc[lVar10 + -2] | puCare[lVar10 + -2];
          lVar10 = lVar10 + -1;
        } while (1 < lVar10);
      }
      lVar10 = uVar9 + 1;
      do {
        puCare[lVar10 + -2] = ~puCare[lVar10 + -2];
        lVar10 = lVar10 + -1;
      } while (1 < lVar10);
      puCare = (uint *)0x0;
    }
  }
  Bdc_ManDecompose(p,puFunc,puCare,nVars,(Vec_Ptr_t *)0x0,1000);
  pBVar4 = Bdc_ManFunc(p,0);
  Bdc_FuncSetCopy(pBVar4,pHop->pConst1);
  if (0 < nVars) {
    uVar9 = 0;
    do {
      uVar1 = uVar9 + 1;
      pBVar4 = Bdc_ManFunc(p,(int)uVar1);
      if ((long)pHop->vPis->nSize <= (long)uVar9) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      Bdc_FuncSetCopy(pBVar4,pHop->vPis->pArray[uVar9]);
      uVar9 = uVar1;
    } while ((uint)nVars != uVar1);
  }
  iVar3 = Bdc_ManNodeNum(p);
  i = nVars + 1;
  if (i < iVar3) {
    do {
      pBVar4 = Bdc_ManFunc(p,i);
      pBVar5 = Bdc_FuncFanin0(pBVar4);
      pvVar6 = Bdc_FuncCopy((Bdc_Fun_t *)((ulong)pBVar5 & 0xfffffffffffffffe));
      pBVar7 = Bdc_FuncFanin1(pBVar4);
      pvVar8 = Bdc_FuncCopy((Bdc_Fun_t *)((ulong)pBVar7 & 0xfffffffffffffffe));
      pCopy = Hop_And(pHop,(Hop_Obj_t *)((ulong)((uint)pBVar5 & 1) ^ (ulong)pvVar6),
                      (Hop_Obj_t *)((ulong)((uint)pBVar7 & 1) ^ (ulong)pvVar8));
      Bdc_FuncSetCopy(pBVar4,pCopy);
      i = i + 1;
    } while (iVar3 != i);
  }
  pBVar4 = Bdc_ManRoot(p);
  pvVar6 = Bdc_FuncCopy((Bdc_Fun_t *)((ulong)pBVar4 & 0xfffffffffffffffe));
  return (Hop_Obj_t *)((ulong)pvVar6 ^ (ulong)((uint)pBVar4 & 1));
}

Assistant:

Hop_Obj_t * Abc_NodeIfNodeResyn( Bdc_Man_t * p, Hop_Man_t * pHop, Hop_Obj_t * pRoot, int nVars, Vec_Int_t * vTruth, unsigned * puCare, float dProb )
{
    unsigned * pTruth;
    Bdc_Fun_t * pFunc;
    int nNodes, i;
    assert( nVars <= 16 );
    // derive truth table
    pTruth = Hop_ManConvertAigToTruth( pHop, Hop_Regular(pRoot), nVars, vTruth, 0 );
    if ( Hop_IsComplement(pRoot) )
        Extra_TruthNot( pTruth, pTruth, nVars );
    // perform power-aware decomposition
    if ( dProb >= 0.0 )
    {
        float Prob = (float)2.0 * dProb * (1.0 - dProb);
        assert( Prob >= 0.0 && Prob <= 0.5 );
        if ( Prob >= 0.4 )
        {
            Extra_TruthNot( puCare, puCare, nVars );
            if ( dProb > 0.5 ) // more 1s than 0s
                Extra_TruthOr( pTruth, pTruth, puCare, nVars );
            else
                Extra_TruthSharp( pTruth, pTruth, puCare, nVars );
            Extra_TruthNot( puCare, puCare, nVars );
            // decompose truth table
            Bdc_ManDecompose( p, pTruth, NULL, nVars, NULL, 1000 );
        }
        else
        {
            // decompose truth table
            Bdc_ManDecompose( p, pTruth, puCare, nVars, NULL, 1000 );
        }
    }
    else
    {
        // decompose truth table
        Bdc_ManDecompose( p, pTruth, puCare, nVars, NULL, 1000 );
    }
    // convert back into HOP
    Bdc_FuncSetCopy( Bdc_ManFunc( p, 0 ), Hop_ManConst1( pHop ) );
    for ( i = 0; i < nVars; i++ )
        Bdc_FuncSetCopy( Bdc_ManFunc( p, i+1 ), Hop_ManPi( pHop, i ) );
    nNodes = Bdc_ManNodeNum(p);
    for ( i = nVars + 1; i < nNodes; i++ )
    {
        pFunc = Bdc_ManFunc( p, i );
        Bdc_FuncSetCopy( pFunc, Hop_And( pHop, Bdc_FunCopyHop(Bdc_FuncFanin0(pFunc)), Bdc_FunCopyHop(Bdc_FuncFanin1(pFunc)) ) );
    }
    return Bdc_FunCopyHop( Bdc_ManRoot(p) );
}